

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::Qrt(BN *__return_storage_ptr__,BN *this)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  uVar4 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < 0x20001fff2) {
    fastQrt(__return_storage_ptr__,this);
  }
  else {
    BN(__return_storage_ptr__,uVar4 | 1,0);
    puVar1 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1;
    puVar2 = (__return_storage_ptr__->ba).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = puVar1;
    puVar6 = puVar2;
    uVar4 = 0;
    while (uVar4 != uVar3) {
      uVar7 = (ulong)puVar1[uVar4] * (ulong)puVar1[uVar4] + (ulong)puVar2[uVar4 * 2];
      puVar2[uVar4 * 2] = (unsigned_short)uVar7;
      for (lVar8 = 1; uVar4 + lVar8 < uVar3; lVar8 = lVar8 + 1) {
        uVar7 = (uVar7 >> 0x10) + (ulong)puVar6[lVar8] +
                (ulong)((uint)puVar1[uVar4] * 2) * (ulong)puVar5[lVar8];
        puVar6[lVar8] = (unsigned_short)uVar7;
      }
      lVar9 = uVar4 + uVar3;
      lVar8 = (uVar7 >> 0x10) + (ulong)puVar2[lVar9];
      puVar2[lVar9] = (unsigned_short)lVar8;
      puVar2[lVar9 + 1] = puVar2[lVar9 + 1] + (short)((ulong)lVar8 >> 0x10);
      puVar6 = puVar6 + 2;
      puVar5 = puVar5 + 1;
      uVar4 = uVar4 + 1;
    }
    anon_unknown.dwarf_c68a::Norm(&__return_storage_ptr__->ba);
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::Qrt() const
{
    if (ba.size() < MaximalSizeForFastMul)
        return fastQrt();

    BN res(2 * ba.size() + 1, 0);
    for (size_t i = 0; i < ba.size(); ++i) {
        bt4 cuv = res.ba[2 * i] + static_cast<bt2>(ba[i]) * ba[i];
        res.ba[2 * i] = cuv;
        for (size_t j = i + 1; j < ba.size(); ++j) {
            cuv = static_cast<bt4>(res.ba[i + j]) +
                ((static_cast<bt4>(ba[i]) * ba[j]) << 1) +
                (cuv >> bz8);
            res.ba[i + j] = cuv;
        }
        cuv = res.ba[i + ba.size()] + (cuv >> bz8);
        res.ba[i + ba.size()] = cuv;
        res.ba[i + ba.size() + 1] += (cuv >> bz8);
    }
    Norm(res.ba);
    return res;
}